

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGB>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformGridMediumProvider *p,Bounds3<float> *args,
          optional<pbrt::SampledGrid<float>_> *args_1,
          optional<pbrt::SampledGrid<pbrt::RGB>_> *args_2,RGBColorSpace **args_3,
          SpectrumHandle *args_4,SampledGrid<float> *args_5,polymorphic_allocator<std::byte> *args_6
          )

{
  optional<pbrt::SampledGrid<float>_> *in_RSI;
  SampledGrid<float> *in_stack_fffffffffffffee8;
  SampledGrid<float> *in_stack_fffffffffffffef0;
  optional<pbrt::SampledGrid<pbrt::RGB>_> *in_stack_fffffffffffffef8;
  SpectrumHandle *in_stack_ffffffffffffff80;
  RGBColorSpace *in_stack_ffffffffffffff88;
  optional<pbrt::SampledGrid<pbrt::RGB>_> *in_stack_ffffffffffffff90;
  optional<pbrt::SampledGrid<float>_> *in_stack_ffffffffffffff98;
  Bounds3f *in_stack_ffffffffffffffa0;
  UniformGridMediumProvider *in_stack_ffffffffffffffa8;
  Allocator in_stack_ffffffffffffffb0;
  SampledGrid<float> *in_stack_ffffffffffffffc0;
  
  optional<pbrt::SampledGrid<float>_>::optional
            (in_RSI,(optional<pbrt::SampledGrid<float>_> *)in_stack_fffffffffffffef8);
  optional<pbrt::SampledGrid<pbrt::RGB>_>::optional
            ((optional<pbrt::SampledGrid<pbrt::RGB>_> *)in_RSI,in_stack_fffffffffffffef8);
  pbrt::SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_fffffffffffffef0,(SpectrumHandle *)in_stack_fffffffffffffee8
            );
  pbrt::SampledGrid<float>::SampledGrid(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pbrt::UniformGridMediumProvider::UniformGridMediumProvider
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0);
  pbrt::SampledGrid<float>::~SampledGrid((SampledGrid<float> *)0x73e210);
  optional<pbrt::SampledGrid<pbrt::RGB>_>::~optional
            ((optional<pbrt::SampledGrid<pbrt::RGB>_> *)0x73e21a);
  optional<pbrt::SampledGrid<float>_>::~optional((optional<pbrt::SampledGrid<float>_> *)0x73e227);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }